

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O2

int __thiscall
Fl_PostScript_File_Device::start_job
          (Fl_PostScript_File_Device *this,FILE *ps_output,int pagecount,Page_Format format,
          Page_Layout layout)

{
  Fl_PostScript_Graphics_Driver *this_00;
  
  this_00 = (Fl_PostScript_Graphics_Driver *)
            (this->super_Fl_Paged_Device).super_Fl_Surface_Device._driver;
  this_00->output = ps_output;
  this_00->ps_filename_ = (char *)0x0;
  Fl_PostScript_Graphics_Driver::start_postscript(this_00,pagecount,format,layout);
  this_00->close_cmd_ = dont_close;
  (*(this->super_Fl_Paged_Device).super_Fl_Surface_Device.super_Fl_Device._vptr_Fl_Device[3])(this);
  return 0;
}

Assistant:

int Fl_PostScript_File_Device::start_job (FILE *ps_output, int pagecount, 
    enum Fl_Paged_Device::Page_Format format, enum Fl_Paged_Device::Page_Layout layout)
{
  Fl_PostScript_Graphics_Driver *ps = driver();
  ps->output = ps_output;
  ps->ps_filename_ = NULL;
  ps->start_postscript(pagecount, format, layout);
  ps->close_command(dont_close); // so that end_job() doesn't close the file
  this->set_current();
  return 0;
}